

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O1

vector<duckdb::CatalogSearchEntry,_true> *
duckdb::CatalogSearchEntry::ParseList
          (vector<duckdb::CatalogSearchEntry,_true> *__return_storage_ptr__,string *input)

{
  idx_t pos;
  CatalogSearchEntry entry;
  idx_t local_78;
  CatalogSearchEntry local_70;
  
  local_78 = 0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>).
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (input->_M_string_length != 0) {
    do {
      ParseInternal(&local_70,input,&local_78);
      ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::
      push_back(&__return_storage_ptr__->
                 super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                ,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.schema._M_dataplus._M_p != &local_70.schema.field_2) {
        operator_delete(local_70.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.catalog._M_dataplus._M_p != &local_70.catalog.field_2) {
        operator_delete(local_70.catalog._M_dataplus._M_p);
      }
    } while (local_78 < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<CatalogSearchEntry> CatalogSearchEntry::ParseList(const string &input) {
	idx_t pos = 0;
	vector<CatalogSearchEntry> result;
	while (pos < input.size()) {
		auto entry = ParseInternal(input, pos);
		result.push_back(entry);
	}
	return result;
}